

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_distinct.cpp
# Opt level: O3

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::LogicalDistinct::ParamsToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,LogicalDistinct *this)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pIVar4;
  const_reference pvVar5;
  pointer pEVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  size_type *psVar8;
  long lVar9;
  size_type __n;
  string local_c0;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  LogicalDistinct *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_a0 = __return_storage_ptr__;
  LogicalOperator::ParamsToString_abi_cxx11_(__return_storage_ptr__,&this->super_LogicalOperator);
  puVar2 = (this->distinct_targets).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->distinct_targets).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = this;
  if (puVar2 != puVar3) {
    local_70[0] = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,anon_var_dwarf_637249a + 8,anon_var_dwarf_637249a + 9);
    this_00 = &local_98->distinct_targets;
    local_90 = local_80;
    local_88 = 0;
    local_80[0] = 0;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](this_00,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[7])(&local_c0,pEVar6);
    ::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_c0._M_dataplus._M_p);
    lVar9 = (long)puVar3 - (long)puVar2;
    paVar1 = &local_c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (lVar9 != 8) {
      __n = 1;
      do {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](this_00,__n);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[7])(local_50);
        plVar7 = (long *)::std::__cxx11::string::replace
                                   ((ulong)local_50,0,(char *)0x0,(ulong)local_70[0]);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c0.field_2._M_allocated_capacity = *psVar8;
          local_c0.field_2._8_8_ = plVar7[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar8;
          local_c0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_c0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        __n = __n + 1;
      } while (lVar9 >> 3 != __n);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Distinct Targets","");
    this_01 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](local_a0,&local_c0);
    ::std::__cxx11::string::operator=((string *)this_01,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  pIVar4 = local_a0;
  LogicalOperator::SetParamsEstimatedCardinality(&local_98->super_LogicalOperator,local_a0);
  return pIVar4;
}

Assistant:

InsertionOrderPreservingMap<string> LogicalDistinct::ParamsToString() const {
	auto result = LogicalOperator::ParamsToString();
	if (!distinct_targets.empty()) {
		result["Distinct Targets"] =
		    StringUtil::Join(distinct_targets, distinct_targets.size(), "\n",
		                     [](const unique_ptr<Expression> &child) { return child->GetName(); });
	}
	SetParamsEstimatedCardinality(result);
	return result;
}